

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

Aig_Obj_t * Aig_ManDupRepr_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  ulong uVar3;
  ulong uVar4;
  
  pAVar2 = (Aig_Obj_t *)(pObj->field_5).pData;
  if (pAVar2 == (Aig_Obj_t *)0x0) {
    if (p->pReprs == (Aig_Obj_t **)0x0) {
LAB_006c9949:
      __assert_fail("p->pReprs != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                    ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
    }
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                    ,0x86,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
    }
    if (p->nReprsAlloc <= pObj->Id) goto LAB_006c992a;
    pAVar2 = p->pReprs[pObj->Id];
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      Aig_ManDupRepr_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
      Aig_ManDupRepr_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
      ppAVar1 = p->pReprs;
      if (ppAVar1 == (Aig_Obj_t **)0x0) goto LAB_006c9949;
      uVar3 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (p->nReprsAlloc <= *(int *)(uVar3 + 0x24)) {
LAB_006c992a:
        __assert_fail("pNode->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRepr.c"
                      ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar2 = ppAVar1[*(int *)(uVar3 + 0x24)];
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        uVar3 = *(ulong *)(uVar3 + 0x28);
      }
      else {
        uVar3 = (ulong)((*(uint *)&pAVar2->field_0x18 ^ *(uint *)(uVar3 + 0x18)) >> 3 & 1) ^
                (ulong)(pAVar2->field_5).pData;
      }
      uVar4 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (p->nReprsAlloc <= *(int *)(uVar4 + 0x24)) goto LAB_006c992a;
      pAVar2 = ppAVar1[*(int *)(uVar4 + 0x24)];
      if (pAVar2 == (Aig_Obj_t *)0x0) {
        uVar4 = *(ulong *)(uVar4 + 0x28);
      }
      else {
        uVar4 = (ulong)((*(uint *)&pAVar2->field_0x18 ^ *(uint *)(uVar4 + 0x18)) >> 3 & 1) ^
                (ulong)(pAVar2->field_5).pData;
      }
      pAVar2 = Aig_And(pNew,(Aig_Obj_t *)(uVar3 ^ (uint)pObj->pFanin0 & 1),
                       (Aig_Obj_t *)((uint)pObj->pFanin1 & 1 ^ uVar4));
    }
    else {
      Aig_ManDupRepr_rec(pNew,p,pAVar2);
      pAVar2 = (Aig_Obj_t *)
               ((ulong)((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar2->field_0x18) >> 3 & 1) ^
               (ulong)(pAVar2->field_5).pData);
    }
    (pObj->field_5).pData = pAVar2;
  }
  return pAVar2;
}

Assistant:

Aig_Obj_t * Aig_ManDupRepr_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pRepr;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( (pRepr = Aig_ObjFindRepr(p, pObj)) )
    {
        Aig_ManDupRepr_rec( pNew, p, pRepr );
        return (Aig_Obj_t *)(pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pRepr->fPhase ^ pObj->fPhase ));
    }
    Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Repr(p, pObj), Aig_ObjChild1Repr(p, pObj) ));
}